

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O3

UBool __thiscall icu_63::RegexCompile::compileInlineInterval(RegexCompile *this)

{
  uint uVar1;
  UVector64 *this_00;
  uint newSize;
  int32_t op;
  int32_t op_00;
  int iVar2;
  UBool UVar3;
  
  if ((this->fIntervalUpper < 0xb) && (this->fIntervalLow <= this->fIntervalUpper)) {
    newSize = blockTopLoc(this,'\0');
    iVar2 = this->fIntervalUpper;
    this_00 = this->fRXPat->fCompiledPat;
    if (iVar2 == 0) {
      UVector64::setSize(this_00,newSize);
      if ((int)newSize <= this->fMatchOpenParen) {
        this->fMatchOpenParen = -1;
      }
      UVar3 = '\x01';
      if ((int)newSize <= this->fMatchCloseParen) {
        this->fMatchCloseParen = -1;
      }
    }
    else {
      uVar1 = this_00->count - 1;
      if ((iVar2 == 1) || (UVar3 = '\0', newSize == uVar1)) {
        op_00 = 0;
        if ((-1 < (int)newSize) && (op_00 = 0, (int)newSize < this_00->count)) {
          op_00 = (int32_t)this_00->elements[newSize];
        }
        op = buildOp(this,6,(uVar1 + iVar2 * 2) - this->fIntervalLow);
        if (this->fIntervalLow == 0) {
          insertOp(this,newSize);
          UVector64::setElementAt(this->fRXPat->fCompiledPat,(long)op,newSize);
        }
        UVar3 = '\x01';
        if (1 < this->fIntervalUpper) {
          iVar2 = 1;
          do {
            if (this->fIntervalLow <= iVar2) {
              appendOp(this,op);
            }
            appendOp(this,op_00);
            iVar2 = iVar2 + 1;
          } while (iVar2 < this->fIntervalUpper);
        }
      }
    }
  }
  else {
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool RegexCompile::compileInlineInterval() {
    if (fIntervalUpper > 10 || fIntervalUpper < fIntervalLow) {
        // Too big to inline.  Fail, which will cause looping code to be generated.
        //   (Upper < Lower picks up unbounded upper and errors, both.)
        return FALSE;
    }

    int32_t   topOfBlock = blockTopLoc(FALSE);
    if (fIntervalUpper == 0) {
        // Pathological case.  Attempt no matches, as if the block doesn't exist.
        // Discard the generated code for the block.
        // If the block included parens, discard the info pertaining to them as well.
        fRXPat->fCompiledPat->setSize(topOfBlock);
        if (fMatchOpenParen >= topOfBlock) {
            fMatchOpenParen = -1;
        }
        if (fMatchCloseParen >= topOfBlock) {
            fMatchCloseParen = -1;
        }
        return TRUE;
    }

    if (topOfBlock != fRXPat->fCompiledPat->size()-1 && fIntervalUpper != 1) {
        // The thing being repeated is not a single op, but some
        //   more complex block.  Do it as a loop, not inlines.
        //   Note that things "repeated" a max of once are handled as inline, because
        //     the one copy of the code already generated is just fine.
        return FALSE;
    }

    // Pick up the opcode that is to be repeated
    //
    int32_t op = (int32_t)fRXPat->fCompiledPat->elementAti(topOfBlock);

    // Compute the pattern location where the inline sequence
    //   will end, and set up the state save op that will be needed.
    //
    int32_t endOfSequenceLoc = fRXPat->fCompiledPat->size()-1
                                + fIntervalUpper + (fIntervalUpper-fIntervalLow);
    int32_t saveOp = buildOp(URX_STATE_SAVE, endOfSequenceLoc);
    if (fIntervalLow == 0) {
        insertOp(topOfBlock);
        fRXPat->fCompiledPat->setElementAt(saveOp, topOfBlock);
    }



    //  Loop, emitting the op for the thing being repeated each time.
    //    Loop starts at 1 because one instance of the op already exists in the pattern,
    //    it was put there when it was originally encountered.
    int32_t i;
    for (i=1; i<fIntervalUpper; i++ ) {
        if (i >= fIntervalLow) {
            appendOp(saveOp);
        }
        appendOp(op);
    }
    return TRUE;
}